

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O0

void __thiscall miniros::ServiceClient::Impl::~Impl(Impl *this)

{
  int in_EDX;
  int in_ESI;
  Impl *in_RDI;
  
  shutdown(in_RDI,in_ESI,in_EDX);
  std::__cxx11::string::~string((string *)&in_RDI->service_md5sum_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4a36c6);
  std::__cxx11::string::~string((string *)&in_RDI->name_);
  std::shared_ptr<miniros::ServiceServerLink>::~shared_ptr
            ((shared_ptr<miniros::ServiceServerLink> *)0x4a36de);
  return;
}

Assistant:

ServiceClient::Impl::~Impl()
{
  shutdown();
}